

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

void __thiscall fasttext::FastText::getSubwordVector(FastText *this,Vector *vec,string *subword)

{
  uint uVar1;
  uint32_t uVar2;
  int32_t iVar3;
  
  Vector::zero(vec);
  uVar2 = Dictionary::hash((this->dict_).
                           super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr,subword);
  uVar1 = ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          bucket;
  iVar3 = Dictionary::nwords((this->dict_).
                             super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr);
  addInputVector(this,vec,uVar2 % uVar1 + iVar3);
  return;
}

Assistant:

void FastText::getSubwordVector(Vector& vec, const std::string& subword) const {
	vec.zero();
	int32_t h = dict_->hash(subword) % args_->bucket;
	h = h + dict_->nwords();
	addInputVector(vec, h);
}